

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::~AmpIO(AmpIO *this)

{
  AmpIO *this_local;
  
  ~AmpIO(this);
  operator_delete(this,0xe58);
  return;
}

Assistant:

AmpIO::~AmpIO()
{
    if (port) {
        std::cerr << "Warning: AmpIO being destroyed while still in use by "
                  << BasePort::PortTypeString(port->GetPortType()) <<" Port" << std::endl;
        port->RemoveBoard(this);
    }
}